

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O3

int __thiscall
pele::physics::reactions::ReactorCvode::react
          (ReactorCvode *this,realtype *rY_in,realtype *rYsrc_in,realtype *rX_in,realtype *rX_src_in
          ,realtype *dt_react,realtype *time,int ncells)

{
  double t0;
  double dVar1;
  Real relTol;
  Real absTol;
  void *sundials_mem;
  int iVar2;
  realtype *__dest;
  Context *sunctx;
  ulong uVar3;
  int iVar4;
  Print *this_00;
  size_t __n;
  long nfeLS;
  Real CvodeActual_time_final;
  long local_1d0;
  realtype local_1c8;
  int local_1bc;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reacting (flattened)\n",0x15);
  t0 = *time;
  dVar1 = *dt_react;
  local_1c8 = 0.0;
  __dest = N_VGetArrayPointer(this->y);
  __n = (long)(ncells * 0x16) << 3;
  memcpy(__dest,rY_in,__n);
  memcpy(this->udata_g->rYsrc_ext,rYsrc_in,(long)(ncells * 0x15) << 3);
  memcpy(this->udata_g->rhoe_init,rX_in,(long)ncells << 3);
  memcpy(this->udata_g->rhoesrc_ext,rX_src_in,(long)ncells << 3);
  CVodeReInit(this->cvode_mem,t0,this->y);
  iVar4 = 1;
  local_1bc = CVode(this->cvode_mem,dVar1 + t0,this->y,&local_1c8,1);
  iVar2 = utils::check_flag(&local_1bc,"CVode",1);
  if (iVar2 == 0) {
    sunctx = amrex::sundials::The_Sundials_Context(0);
    sundials_mem = this->cvode_mem;
    iVar2 = this->udata_g->ncells;
    relTol = this->relTol;
    absTol = this->absTol;
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"cvode","");
    ReactorBase::set_sundials_solver_tols
              ((ReactorBase *)this,sunctx,sundials_mem,iVar2,relTol,absTol,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    memcpy(rY_in,__dest,__n);
    if (0 < ncells) {
      uVar3 = 0;
      do {
        rX_in[uVar3] = *dt_react * rX_src_in[uVar3] + rX_in[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)ncells != uVar3);
    }
    if (1 < this->udata_g->verbose) {
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Additional verbose info --\n",0x1b);
      this_00 = (Print *)local_1b8;
      amrex::Print::~Print(this_00);
      print_final_stats((ReactorCvode *)this_00,this->cvode_mem,this->LS != (SUNLinearSolver)0x0);
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"\n -------------------------------------\n",0x28);
      amrex::Print::~Print((Print *)local_1b8);
    }
    iVar4 = 0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1d0 = 0;
    CVodeGetNumRhsEvals(this->cvode_mem,(long *)local_1b8);
    if (this->LS != (SUNLinearSolver)0x0) {
      CVodeGetNumLinRhsEvals(this->cvode_mem,&local_1d0);
      iVar4 = (int)local_1d0;
    }
    iVar4 = iVar4 + local_1b8._0_4_;
  }
  return iVar4;
}

Assistant:

int
ReactorCvode::react(
  realtype* rY_in,
  realtype* rYsrc_in,
  realtype* rX_in,
  realtype* rX_src_in,
  realtype& dt_react,
  realtype& time,
  int ncells
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t stream
#endif
)
{
  BL_PROFILE("Pele::ReactorCvode::react()");

  std::cout << "Reacting (flattened)\n";

  // CPU and GPU version are very different such that the entire file
  // is split between a GPU region and a CPU region

  amrex::Real time_start = time;
  amrex::Real time_final = time + dt_react;
  amrex::Real CvodeActual_time_final = 0.0;

  //----------------------------------------------------------
  // GPU Region
  //----------------------------------------------------------
#ifdef AMREX_USE_GPU
  int neq_tot = (NUM_SPECIES + 1) * ncells;
  SUNNonlinearSolver NLS = nullptr;
  SUNLinearSolver LS = nullptr;
  SUNMatrix A = nullptr;
  void* cvode_mem = nullptr;

  // Fill user_data
  amrex::Gpu::streamSynchronize();
  CVODEUserData* user_data = new CVODEUserData{};
  allocUserData(user_data, ncells, A, stream);

  // Solution vector and execution policy
  auto y = utils::setNVectorGPU(neq_tot, atomic_reductions, stream);

  // Solution data array
  amrex::Real* yvec_d = N_VGetDeviceArrayPointer(y);

  // Fill data
  BL_PROFILE_VAR("Pele::ReactorCvode::react():ASyncCopy", AsyncCopy);
  amrex::Gpu::htod_memcpy_async(yvec_d, rY_in, sizeof(amrex::Real) * (neq_tot));
  amrex::Gpu::htod_memcpy_async(
    user_data->rYsrc_ext, rYsrc_in, sizeof(amrex::Real) * NUM_SPECIES * ncells);
  amrex::Gpu::htod_memcpy_async(
    user_data->rhoe_init, rX_in, sizeof(amrex::Real) * ncells);
  amrex::Gpu::htod_memcpy_async(
    user_data->rhoesrc_ext, rX_src_in, sizeof(amrex::Real) * ncells);
  BL_PROFILE_VAR_STOP(AsyncCopy);

#ifdef AMREX_USE_OMP
  Gpu::Device::streamSynchronize();
#endif

  // Initialize integrator
  cvode_mem = CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(cvode_mem, "CVodeCreate", 0))
    return (1);
  int flag = CVodeSetUserData(cvode_mem, static_cast<void*>(user_data));

  // Call CVodeInit to initialize the integrator memory and specify the
  //  user's right hand side function, the inital time, and
  //  initial dependent variable vector y.
  flag = CVodeInit(cvode_mem, cF_RHS, time_start, y);
  if (utils::check_flag(&flag, "CVodeInit", 1))
    return (1);

  // Setup tolerances with typical values
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, user_data->ncells,
    relTol, absTol, "cvode");

  // Solver data
  if (user_data->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }
  } else if (user_data->solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
    LS = SUNLinSol_cuSolverSp_batchQR(
      y, A, user_data->cusolverHandle,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(LS), "SUNLinSol_cuSolverSp_batchQR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);

#else
    amrex::Abort(
      "Shoudn't be there. solve_type sparse_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::customDirect) {
#if defined(AMREX_USE_CUDA)
    LS = cvode::SUNLinSol_dense_custom(
      y, A, stream, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_dense_custom", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);

    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type custom_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    LS = SUNLinSol_MagmaDense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_MagmaDense", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type magma_direct only available with "
      "PELE_USE_MAGMA = TRUE");
#endif
  } else if (user_data->solve_type == cvode::GMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  } else if (user_data->solve_type == cvode::precGMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  }

  // Analytical Jac. data for direct solver
  // Both sparse/custom direct uses the same Jacobian functions
  if (user_data->analytical_jacobian == 1) {
    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (user_data->precond_type == cvode::sparseSimpleAJac) {
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters);
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1))
    return (1);
  flag = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1))
    return (1);
  flag = CVodeSetMaxOrd(cvode_mem, user_data->maxOrder);
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1))
    return (1);

  // Actual CVODE solve
  BL_PROFILE_VAR("Pele::ReactorCvode::react():CVode", AroundCVODE);
  flag = CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
  if (utils::check_flag(&flag, "CVode", 1))
    return (1);
  BL_PROFILE_VAR_STOP(AroundCVODE);

#ifdef MOD_REACTOR
  dt_react =
    time_start - CvodeActual_time_final; // Actual dt_react performed by Cvode
  time += dt_react;                      // Increment time in reactor mode
#endif

#ifdef AMREX_USE_OMP
  Gpu::Device::streamSynchronize();
#endif

  // Get the result back
  BL_PROFILE_VAR_START(AsyncCopy);
  amrex::Gpu::dtoh_memcpy_async(rY_in, yvec_d, sizeof(amrex::Real) * neq_tot);
  for (int i = 0; i < ncells; i++) {
    rX_in[i] = rX_in[i] + dt_react * rX_src_in[i];
  }
  BL_PROFILE_VAR_STOP(AsyncCopy);

  // Get the number of RHS evaluations
  long int nfe;
  flag = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (user_data->verbose > 1) {
    print_final_stats(cvode_mem, LS != nullptr);
  }

  // Clean up
  N_VDestroy(y);
  CVodeFree(&cvode_mem);

  if (LS != nullptr) {
    SUNLinSolFree(LS);
  }
  if (A != nullptr) {
    SUNMatDestroy(A);
  }
  freeUserData(user_data);

  //----------------------------------------------------------
  // CPU Region
  //----------------------------------------------------------
#else
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  // Pointer of solution vector
  amrex::Real* yvec_d = N_VGetArrayPointer(y);
  std::memcpy(
    yvec_d, rY_in, sizeof(amrex::Real) * ((NUM_SPECIES + 1) * ncells));
  std::memcpy(
    udata_g->rYsrc_ext, rYsrc_in, sizeof(amrex::Real) * (NUM_SPECIES * ncells));
  std::memcpy(udata_g->rhoe_init, rX_in, sizeof(amrex::Real) * ncells);
  std::memcpy(udata_g->rhoesrc_ext, rX_src_in, sizeof(amrex::Real) * ncells);

  // ReInit CVODE is faster
  CVodeReInit(cvode_mem, time_start, y);

  BL_PROFILE_VAR("Pele::react():CVode", AroundCVODE);
  int flag =
    CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
  // ONE STEP MODE FOR DEBUGGING
  // flag = CVode(cvode_mem, time_final, y, &CvodeActual_time_final,
  // CV_ONE_STEP);
  if (utils::check_flag(&flag, "CVode", 1) != 0) {
    return (1);
  }
  BL_PROFILE_VAR_STOP(AroundCVODE);

  // Update TypicalValues
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

#ifdef MOD_REACTOR
  dt_react =
    time_start - CvodeActual_time_final; // Actual dt_react performed by Cvode
  time += dt_react;                      // Increment time in reactor mode
#endif

  // Pack data to return in main routine external
  std::memcpy(
    rY_in, yvec_d, sizeof(amrex::Real) * ((NUM_SPECIES + 1) * ncells));
  for (int i = 0; i < ncells; i++) {
    rX_in[i] = rX_in[i] + dt_react * rX_src_in[i];
  }

  // cppcheck-suppress knownConditionTrueFalse
  if ((udata_g->verbose > 1) && (omp_thread == 0)) {
    amrex::Print() << "Additional verbose info --\n";
    print_final_stats(cvode_mem, LS != nullptr);
    amrex::Print() << "\n -------------------------------------\n";
  }

  // Get estimate of how hard the integration process was
  long int nfe = 0;
  long int nfeLS = 0;
  CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (LS != nullptr) {
    flag = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  }
  nfe += nfeLS;
#endif

  return static_cast<int>(nfe);
}